

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O0

void __thiscall
mjs::array_object::put(array_object *this,string *name,value *val,property_attribute attr)

{
  bool bVar1;
  property_attribute a;
  bool local_71;
  bool local_61;
  wstring_view local_60;
  wstring_view local_50;
  uint32_t local_3c;
  undefined1 auStack_38 [4];
  uint32_t index;
  property_attribute local_24;
  value *pvStack_20;
  property_attribute attr_local;
  value *val_local;
  string *name_local;
  array_object *this_local;
  
  local_24 = attr;
  pvStack_20 = val;
  val_local = (value *)name;
  name_local = (string *)this;
  _auStack_38 = string::view(name);
  bVar1 = object::can_put((object *)this,(wstring_view *)auStack_38);
  local_61 = true;
  if (bVar1) {
    local_61 = native_object::do_native_put
                         (&this->super_native_object,(string *)val_local,pvStack_20);
  }
  if (local_61 == false) {
    local_50 = string::view((string *)val_local);
    local_3c = index_value_from_string(&local_50);
    if (local_3c != 0xffffffff) {
      bVar1 = object::is_extensible((object *)this);
      local_71 = false;
      if (!bVar1) {
        local_60 = string::view((string *)val_local);
        a = object::own_property_attributes((object *)this,&local_60);
        local_71 = is_valid(a);
      }
      if (local_71 != false) {
        return;
      }
      if (this->length_ <= local_3c) {
        this->length_ = local_3c + 1;
      }
    }
    object::put((object *)this,(string *)val_local,pvStack_20,local_24);
  }
  return;
}

Assistant:

void put(const string& name, const value& val, property_attribute attr) override {
        if (!can_put(name.view()) || do_native_put(name, val)) {
            return;
        }

        const uint32_t index = index_value_from_string(name.view());
        if (index != invalid_index_value) {
            if (!is_extensible() && is_valid(own_property_attributes(name.view()))) {
                return;
            }
            if (index >= length_) {
                length_ = index + 1;
            }
        }

        object::put(name, val, attr);
    }